

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::PrintMessagePreamble(cmake *this,MessageType t,ostream *msg)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  allocator local_51;
  string local_50;
  char *local_30;
  char *suppress;
  ostream *msg_local;
  cmake *pcStack_18;
  MessageType t_local;
  cmake *this_local;
  
  suppress = (char *)msg;
  msg_local._4_4_ = t;
  pcStack_18 = this;
  if (t == FATAL_ERROR) {
    std::operator<<(msg,"CMake Error");
  }
  else if (t == INTERNAL_ERROR) {
    std::operator<<(msg,"CMake Internal Error (please report a bug)");
  }
  else if (t == LOG) {
    std::operator<<(msg,"CMake Debug Log");
  }
  else if (t == DEPRECATION_ERROR) {
    std::operator<<(msg,"CMake Deprecation Error");
  }
  else if (t == DEPRECATION_WARNING) {
    std::operator<<(msg,"CMake Deprecation Warning");
  }
  else {
    std::operator<<(msg,"CMake Warning");
    if (msg_local._4_4_ == AUTHOR_WARNING) {
      this_00 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_50,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",&local_51);
      val = cmState::GetCacheEntryValue(this_00,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      local_30 = val;
      if ((val != (char *)0x0) && (bVar1 = cmSystemTools::IsOn(val), bVar1)) {
        return false;
      }
      std::operator<<((ostream *)suppress," (dev)");
    }
  }
  return true;
}

Assistant:

bool cmake::PrintMessagePreamble(cmake::MessageType t, std::ostream& msg)
{
  // Construct the message header.
  if(t == cmake::FATAL_ERROR)
    {
    msg << "CMake Error";
    }
  else if(t == cmake::INTERNAL_ERROR)
    {
    msg << "CMake Internal Error (please report a bug)";
    }
  else if(t == cmake::LOG)
    {
    msg << "CMake Debug Log";
    }
  else if(t == cmake::DEPRECATION_ERROR)
    {
    msg << "CMake Deprecation Error";
    }
  else if (t == cmake::DEPRECATION_WARNING)
    {
    msg << "CMake Deprecation Warning";
    }
  else
    {
    msg << "CMake Warning";
    if(t == cmake::AUTHOR_WARNING)
      {
      // Allow suppression of these warnings.
      const char* suppress = this->State->GetCacheEntryValue(
                                        "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
      if(suppress && cmSystemTools::IsOn(suppress))
        {
        return false;
        }
      msg << " (dev)";
      }
    }
  return true;
}